

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::const_equals(char *str,vm_val_t *val)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  size_t sVar3;
  int *in_RSI;
  char *in_RDI;
  size_t len;
  char *str2;
  vm_val_t *in_stack_ffffffffffffffc8;
  size_t sVar4;
  bool local_29;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar5;
  
  if ((*in_RSI == 5) && (iVar1 = CVmObjStringBuffer::is_string_buffer_obj(0), iVar1 != 0)) {
    vm_objp(0);
    iVar1 = CVmObjStringBuffer::equals_str
                      ((CVmObjStringBuffer *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    return iVar1;
  }
  pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffffc8);
  if (pcVar2 == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    __n = vmb_get_len((char *)0x393468);
    sVar4 = __n;
    sVar3 = vmb_get_len((char *)0x393480);
    local_29 = false;
    if (sVar4 == sVar3) {
      iVar1 = memcmp(in_RDI + 2,pcVar2 + 2,__n);
      local_29 = iVar1 == 0;
    }
    uVar5 = (uint)local_29;
  }
  return uVar5;
}

Assistant:

int CVmObjString::const_equals(VMG_ const char *str, const vm_val_t *val)
{
    const char *str2;
    size_t len;

    /* if the other value is a string buffer, compare to its contents */
    if (val->typ == VM_OBJ
        && CVmObjStringBuffer::is_string_buffer_obj(vmg_ val->val.obj))
        return ((CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj))
            ->equals_str(str);

    /* get the other value as a string */
    str2 = val->get_as_string(vmg0_);

    /* if the object doesn't have an underlying string, we don't match */
    if (str2 == 0)
        return FALSE;

    /* 
     *   if their lengths match, and the bytes match exactly, we have a
     *   match; otherwise, they're not equal 
     */
    len = vmb_get_len(str);
    return (len == vmb_get_len(str2)
            && memcmp(str + VMB_LEN, str2 + VMB_LEN, len) == 0);
}